

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void * mcpl_internal_realloc(void *mem,size_t new_size)

{
  void *pvVar1;
  
  pvVar1 = realloc(mem,new_size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  mcpl_error("memory allocation failed");
}

Assistant:

MCPL_LOCAL void * mcpl_internal_realloc( void* mem, size_t new_size)
{
  void * res = realloc( mem, new_size );
  if (!res)
    mcpl_error("memory allocation failed");
  return res;
}